

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_dependencies.cpp
# Opt level: O2

void duckdb::DuckDBDependenciesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  long lVar3;
  _func_int **pp_Var4;
  _func_int **__n;
  _func_int **pp_Var5;
  ulong index;
  string dependency_type_str;
  Value local_90;
  string local_50;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var5 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)((long)pp_Var5 - (long)pp_Var4 >> 5)) {
    for (index = 0; (__n < (_func_int **)((long)pp_Var5 - (long)pp_Var4 >> 5) && (index < 0x800));
        index = index + 1) {
      pvVar2 = vector<duckdb::DependencyInformation,_true>::get<true>
                         ((vector<duckdb::DependencyInformation,_true> *)(pGVar1 + 1),(size_type)__n
                         );
      Value::BIGINT(&local_90,0);
      DataChunk::SetValue(output,0,index,&local_90);
      Value::~Value(&local_90);
      lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->object->oid);
      Value::BIGINT(&local_90,lVar3);
      DataChunk::SetValue(output,1,index,&local_90);
      Value::~Value(&local_90);
      Value::INTEGER(&local_90,0);
      DataChunk::SetValue(output,2,index,&local_90);
      Value::~Value(&local_90);
      Value::BIGINT(&local_90,0);
      DataChunk::SetValue(output,3,index,&local_90);
      Value::~Value(&local_90);
      lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->dependent->oid);
      Value::BIGINT(&local_90,lVar3);
      DataChunk::SetValue(output,4,index,&local_90);
      Value::~Value(&local_90);
      Value::INTEGER(&local_90,0);
      DataChunk::SetValue(output,5,index,&local_90);
      Value::~Value(&local_90);
      dependency_type_str._M_dataplus._M_p = (pointer)&dependency_type_str.field_2;
      dependency_type_str._M_string_length = 0;
      dependency_type_str.field_2._M_local_buf[0] = '\0';
      ::std::__cxx11::string::assign((char *)&dependency_type_str);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&dependency_type_str);
      Value::Value(&local_90,&local_50);
      DataChunk::SetValue(output,6,index,&local_90);
      Value::~Value(&local_90);
      ::std::__cxx11::string::~string((string *)&local_50);
      pGVar1[4]._vptr_GlobalTableFunctionState =
           (_func_int **)((long)pGVar1[4]._vptr_GlobalTableFunctionState + 1);
      ::std::__cxx11::string::~string((string *)&dependency_type_str);
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var5 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBDependenciesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBDependenciesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		// return values:
		// classid, LogicalType::BIGINT
		output.SetValue(0, count, Value::BIGINT(0));
		// objid, LogicalType::BIGINT
		output.SetValue(1, count, Value::BIGINT(NumericCast<int64_t>(entry.object.oid)));
		// objsubid, LogicalType::INTEGER
		output.SetValue(2, count, Value::INTEGER(0));
		// refclassid, LogicalType::BIGINT
		output.SetValue(3, count, Value::BIGINT(0));
		// refobjid, LogicalType::BIGINT
		output.SetValue(4, count, Value::BIGINT(NumericCast<int64_t>(entry.dependent.oid)));
		// refobjsubid, LogicalType::INTEGER
		output.SetValue(5, count, Value::INTEGER(0));
		// deptype, LogicalType::VARCHAR
		string dependency_type_str;
		if (entry.flags.IsBlocking()) {
			dependency_type_str = "n";
		} else {
			dependency_type_str = "a";
		}
		output.SetValue(6, count, Value(dependency_type_str));

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}